

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Instr * __thiscall IR::Instr::SinkInstrBefore(Instr *this,Instr *instrTarget)

{
  StackSym *pSVar1;
  Instr *pIVar2;
  
  if (this->m_next == instrTarget) {
    pIVar2 = this->m_prev;
  }
  else {
    if (this->m_src1 != (Opnd *)0x0) {
      pSVar1 = Opnd::GetStackSym(this->m_src1);
      if ((pSVar1 != (StackSym *)0x0) && ((pSVar1->field_0x18 & 1) == 0)) {
        HoistSrc1(this,Ld_A,RegNOREG,(StackSym *)0x0);
      }
      if (this->m_src2 != (Opnd *)0x0) {
        pSVar1 = Opnd::GetStackSym(this->m_src2);
        if ((pSVar1 != (StackSym *)0x0) && ((pSVar1->field_0x18 & 1) == 0)) {
          HoistSrc2(this,Ld_A,RegNOREG,(StackSym *)0x0);
        }
      }
    }
    pIVar2 = this->m_prev;
    Unlink(this);
    InsertBefore(instrTarget,this);
  }
  return pIVar2;
}

Assistant:

IR::Instr *
Instr::SinkInstrBefore(IR::Instr * instrTarget)
{
    // Move this instruction down to the target location, preserving
    // the use(s), if necessary, from redefinition between the original
    // location and the new one.

    if (this->m_next == instrTarget)
    {
        return this->m_prev;
    }

    StackSym *sym;
    if (this->m_src1)
    {
        sym = this->m_src1->GetStackSym();
        if (sym && !sym->m_isSingleDef)
        {
            this->HoistSrc1(Js::OpCode::Ld_A);
        }

        if (this->m_src2)
        {
            sym = this->m_src2->GetStackSym();
            if (sym && !sym->m_isSingleDef)
            {
                this->HoistSrc2(Js::OpCode::Ld_A);
            }
        }
    }

    // Move the instruction down to the target. Return the instruction
    // that preceded the sunk instruction at its original location.
    // (This lets the caller find a Ld_A that this call inserted.)
    IR::Instr * instrPrev = this->m_prev;
    this->Unlink();
    instrTarget->InsertBefore(this);
    return instrPrev;
}